

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afshaper.c
# Opt level: O1

FT_ULong af_shaper_get_elem(AF_StyleMetrics_conflict metrics,void *buf_,uint idx,FT_Long *advance,
                           FT_Long *y_offset)

{
  undefined8 in_RAX;
  long lVar1;
  long lVar2;
  FT_ULong FVar3;
  ulong uVar4;
  uint gcount;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  lVar1 = hb_buffer_get_glyph_infos(buf_,&local_34);
  lVar2 = hb_buffer_get_glyph_positions(buf_,&local_34);
  if (idx < local_34) {
    uVar4 = (ulong)idx;
    if (advance != (FT_Long *)0x0) {
      *advance = (long)*(int *)(lVar2 + uVar4 * 0x14);
    }
    if (y_offset != (FT_Long *)0x0) {
      *y_offset = (long)*(int *)(lVar2 + 0xc + uVar4 * 0x14);
    }
    FVar3 = (FT_ULong)*(uint *)(lVar1 + uVar4 * 0x14);
  }
  else {
    FVar3 = 0;
  }
  return FVar3;
}

Assistant:

FT_ULong
  af_shaper_get_elem( AF_StyleMetrics  metrics,
                      void*            buf_,
                      unsigned int     idx,
                      FT_Long*         advance,
                      FT_Long*         y_offset )
  {
    hb_buffer_t*          buf = (hb_buffer_t*)buf_;
    hb_glyph_info_t*      ginfo;
    hb_glyph_position_t*  gpos;
    unsigned int          gcount;

    FT_UNUSED( metrics );


    ginfo = hb_buffer_get_glyph_infos( buf, &gcount );
    gpos  = hb_buffer_get_glyph_positions( buf, &gcount );

    if ( idx >= gcount )
      return 0;

    if ( advance )
      *advance = gpos[idx].x_advance;
    if ( y_offset )
      *y_offset = gpos[idx].y_offset;

    return ginfo[idx].codepoint;
  }